

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

void __thiscall FIX::SessionState::SessionState(SessionState *this)

{
  SessionState *this_local;
  
  MessageStore::MessageStore(&this->super_MessageStore);
  Log::Log(&this->super_Log);
  (this->super_MessageStore)._vptr_MessageStore = (_func_int **)&PTR__SessionState_0045e888;
  (this->super_Log)._vptr_Log = (_func_int **)&DAT_0045e928;
  this->m_enabled = true;
  this->m_receivedLogon = false;
  this->m_sentLogout = false;
  this->m_sentLogon = false;
  this->m_sentReset = false;
  this->m_receivedReset = false;
  this->m_initiate = false;
  this->m_logonTimeout = 10;
  this->m_logoutTimeout = 2;
  this->m_testRequest = 0;
  std::pair<int,_int>::pair<int,_int,_true>(&this->m_resendRange);
  HeartBtInt::HeartBtInt(&this->m_heartBtInt);
  UtcTimeStamp::UtcTimeStamp(&this->m_lastSentTime);
  UtcTimeStamp::UtcTimeStamp(&this->m_lastReceivedTime);
  std::__cxx11::string::string((string *)&this->m_logoutReason);
  std::map<int,_FIX::Message,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::Message>_>_>
  ::map(&this->m_queue);
  this->m_pStore = (MessageStore *)0x0;
  this->m_pLog = (Log *)0x0;
  NullLog::NullLog(&this->m_nullLog);
  Mutex::Mutex(&this->m_mutex);
  return;
}

Assistant:

SessionState()
: m_enabled( true ), m_receivedLogon( false ),
  m_sentLogout( false ), m_sentLogon( false ),
  m_sentReset( false ), m_receivedReset( false ),
  m_initiate( false ), m_logonTimeout( 10 ), 
  m_logoutTimeout( 2 ), m_testRequest( 0 ),
  m_pStore( 0 ), m_pLog( 0 ) {}